

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O2

REF_STATUS ref_smooth_tet_quality_around(REF_GRID ref_grid,REF_INT node,REF_DBL *min_quality)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  bool bVar3;
  uint uVar4;
  undefined8 uVar5;
  REF_STATUS RVar6;
  REF_INT cell;
  char *pcVar7;
  ulong uVar8;
  double dVar9;
  REF_DBL quality;
  REF_INT nodes [27];
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[8];
  *min_quality = 1.0;
  uVar8 = 0xffffffff;
  cell = -1;
  if (-1 < node) {
    pRVar1 = ref_cell->ref_adj;
    uVar8 = 0xffffffff;
    cell = -1;
    if (node < pRVar1->nnode) {
      uVar4 = pRVar1->first[(uint)node];
      uVar8 = 0xffffffff;
      cell = -1;
      if ((long)(int)uVar4 != -1) {
        cell = pRVar1->item[(int)uVar4].ref;
        uVar8 = (ulong)uVar4;
      }
    }
  }
  bVar3 = false;
  while( true ) {
    if ((int)uVar8 == -1) {
      RVar6 = 0;
      if (!bVar3) {
        *min_quality = -2.0;
        RVar6 = 5;
      }
      return RVar6;
    }
    uVar4 = ref_cell_nodes(ref_cell,cell,nodes);
    if (uVar4 != 0) break;
    uVar4 = ref_node_tet_quality(ref_node,nodes,&quality);
    if (uVar4 != 0) {
      pcVar7 = "qual";
      uVar5 = 0x4ee;
      goto LAB_001d5b4f;
    }
    dVar9 = *min_quality;
    if (quality <= *min_quality) {
      dVar9 = quality;
    }
    *min_quality = dVar9;
    pRVar2 = ref_cell->ref_adj->item;
    uVar8 = (ulong)pRVar2[(int)uVar8].next;
    bVar3 = true;
    cell = -1;
    if (uVar8 != 0xffffffffffffffff) {
      cell = pRVar2[uVar8].ref;
    }
  }
  pcVar7 = "nodes";
  uVar5 = 0x4ec;
LAB_001d5b4f:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",uVar5,
         "ref_smooth_tet_quality_around",(ulong)uVar4,pcVar7);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_tet_quality_around(REF_GRID ref_grid,
                                                 REF_INT node,
                                                 REF_DBL *min_quality) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL none_found = REF_TRUE;
  REF_DBL quality;

  *min_quality = 1.0;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    none_found = REF_FALSE;
    RSS(ref_node_tet_quality(ref_node, nodes, &quality), "qual");
    *min_quality = MIN(*min_quality, quality);
  }

  if (none_found) {
    *min_quality = -2.0;
    return REF_NOT_FOUND;
  }

  return REF_SUCCESS;
}